

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax*>::
emplace_back<slang::syntax::LocalVariableDeclarationSyntax*>
          (SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax*> *this,
          LocalVariableDeclarationSyntax **args)

{
  iterator ppLVar1;
  LocalVariableDeclarationSyntax **args_local;
  SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*> *this_local;
  
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    ppLVar1 = SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>::end
                        ((SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*> *)this);
    this_local = (SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*> *)
                 emplaceRealloc<slang::syntax::LocalVariableDeclarationSyntax*>(this,ppLVar1,args);
  }
  else {
    ppLVar1 = SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>::end
                        ((SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*> *)this);
    *ppLVar1 = *args;
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    this_local = (SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*> *)
                 SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>::back
                           ((SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*> *)this
                           );
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }